

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  uint uVar1;
  FT_Memory memory_00;
  CFF_Font pCVar2;
  CFF_VarRegion *pCVar3;
  uint uVar4;
  FT_Int32 FVar5;
  CFF_VarData *pCVar6;
  FT_Int32 *pFVar7;
  CFF_AxisCoords *pCVar8;
  FT_Long FVar9;
  FT_Fixed *pFVar10;
  FT_Int32 local_70;
  FT_Fixed axisScalar;
  CFF_AxisCoords *axis;
  CFF_VarRegion *varRegion;
  uint local_50;
  FT_UInt idx;
  FT_UInt j;
  FT_UInt master;
  CFF_VarData *varData;
  CFF_VStore vs;
  FT_UInt len;
  FT_Memory memory;
  FT_Fixed *pFStack_20;
  FT_Error error;
  FT_Fixed *NDV_local;
  FT_UInt lenNDV_local;
  FT_UInt vsindex_local;
  CFF_Blend blend_local;
  
  memory._4_4_ = 0;
  memory_00 = blend->font->memory;
  if ((lenNDV == 0) || (NDV != (FT_Fixed *)0x0)) {
    blend->builtBV = '\0';
    pCVar2 = blend->font;
    if ((lenNDV == 0) || (lenNDV == (pCVar2->vstore).axisCount)) {
      if (vsindex < (pCVar2->vstore).dataCount) {
        pCVar6 = (pCVar2->vstore).varData + vsindex;
        uVar4 = pCVar6->regionIdxCount + 1;
        pFStack_20 = NDV;
        NDV_local._0_4_ = lenNDV;
        NDV_local._4_4_ = vsindex;
        _lenNDV_local = blend;
        pFVar7 = (FT_Int32 *)
                 ft_mem_qrealloc(memory_00,4,(ulong)blend->lenBV,(ulong)uVar4,blend->BV,
                                 (FT_Error *)((long)&memory + 4));
        _lenNDV_local->BV = pFVar7;
        if (memory._4_4_ == 0) {
          _lenNDV_local->lenBV = uVar4;
          for (idx = 0; idx < uVar4; idx = idx + 1) {
            if (idx == 0) {
              *_lenNDV_local->BV = 0x10000;
            }
            else {
              uVar1 = pCVar6->regionIndices[idx - 1];
              pCVar3 = (pCVar2->vstore).varRegionList;
              if ((pCVar2->vstore).regionCount <= uVar1) {
                return 3;
              }
              if ((FT_UInt)NDV_local == 0) {
                _lenNDV_local->BV[idx] = 0;
              }
              else {
                _lenNDV_local->BV[idx] = 0x10000;
                for (local_50 = 0; local_50 < (FT_UInt)NDV_local; local_50 = local_50 + 1) {
                  pCVar8 = pCVar3[uVar1].axisList + local_50;
                  if ((pCVar8->peakCoord < pCVar8->startCoord) ||
                     (pCVar8->endCoord < pCVar8->peakCoord)) {
                    local_70 = 0x10000;
                  }
                  else if (((pCVar8->startCoord < 0) && (0 < pCVar8->endCoord)) &&
                          (pCVar8->peakCoord != 0)) {
                    local_70 = 0x10000;
                  }
                  else if (pCVar8->peakCoord == 0) {
                    local_70 = 0x10000;
                  }
                  else if ((pFStack_20[local_50] < pCVar8->startCoord) ||
                          (pCVar8->endCoord < pFStack_20[local_50])) {
                    local_70 = 0;
                  }
                  else if (pFStack_20[local_50] == pCVar8->peakCoord) {
                    local_70 = 0x10000;
                  }
                  else if (pFStack_20[local_50] < pCVar8->peakCoord) {
                    FVar9 = FT_DivFix(pFStack_20[local_50] - pCVar8->startCoord,
                                      pCVar8->peakCoord - pCVar8->startCoord);
                    local_70 = (FT_Int32)FVar9;
                  }
                  else {
                    FVar9 = FT_DivFix(pCVar8->endCoord - pFStack_20[local_50],
                                      pCVar8->endCoord - pCVar8->peakCoord);
                    local_70 = (FT_Int32)FVar9;
                  }
                  FVar5 = FT_MulFix_x86_64(_lenNDV_local->BV[idx],local_70);
                  _lenNDV_local->BV[idx] = FVar5;
                }
              }
            }
          }
          _lenNDV_local->lastVsindex = NDV_local._4_4_;
          if ((FT_UInt)NDV_local != 0) {
            pFVar10 = (FT_Fixed *)
                      ft_mem_qrealloc(memory_00,8,(ulong)_lenNDV_local->lenNDV,
                                      (ulong)(FT_UInt)NDV_local,_lenNDV_local->lastNDV,
                                      (FT_Error *)((long)&memory + 4));
            _lenNDV_local->lastNDV = pFVar10;
            if (memory._4_4_ != 0) {
              return memory._4_4_;
            }
            memcpy(_lenNDV_local->lastNDV,pFStack_20,(ulong)(FT_UInt)NDV_local << 3);
          }
          _lenNDV_local->lenNDV = (FT_UInt)NDV_local;
          _lenNDV_local->builtBV = '\x01';
        }
      }
      else {
        memory._4_4_ = 3;
      }
    }
    else {
      memory._4_4_ = 3;
    }
  }
  else {
    memory._4_4_ = 3;
  }
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    /* protect against malformed fonts */
    if ( !( lenNDV == 0 || NDV ) )
    {
      FT_TRACE4(( " cff_blend_build_vector:"
                  " Malformed Normalize Design Vector data\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_QRENEW_ARRAY( blend->BV, blend->lenBV, len ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n", len ));
        FT_TRACE4(( "   [ %f ", blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_QRENEW_ARRAY( blend->lastNDV, blend->lenNDV, lenNDV ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }